

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_callWithMemoryBuffer_TestShell::createTest
          (TEST_MockExpectedCall_callWithMemoryBuffer_TestShell *this)

{
  TEST_MockExpectedCall_callWithMemoryBuffer_Test *this_00;
  TEST_MockExpectedCall_callWithMemoryBuffer_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_callWithMemoryBuffer_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x143);
  TEST_MockExpectedCall_callWithMemoryBuffer_Test::TEST_MockExpectedCall_callWithMemoryBuffer_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithMemoryBuffer)
{
    const SimpleString paramName = "paramName";
    const unsigned char value[] = { 0x12, 0xFE, 0xA1 };
    call->withParameter(paramName, value, sizeof(value));
    STRCMP_EQUAL("const unsigned char*", call->getInputParameterType(paramName).asCharString());
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getMemoryBuffer());
    LONGS_EQUAL(sizeof(value),  call->getInputParameter(paramName).getSize());
    STRCMP_CONTAINS("funcName -> const unsigned char* paramName: <Size = 3 | HexContents = 12 FE A1>", call->callToString().asCharString());
}